

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O3

Instr * __thiscall
LowererMDArch::LoadDoubleHelperArgument(LowererMDArch *this,Instr *instrInsert,Opnd *opndArg)

{
  code *pcVar1;
  IRType IVar2;
  bool bVar3;
  RegOpnd *dstOpnd;
  Instr *pIVar4;
  undefined4 *puVar5;
  
  IVar2 = opndArg->m_type;
  if (IVar2 == TyFloat32) {
    dstOpnd = IR::RegOpnd::New(TyFloat64,this->m_func);
    pIVar4 = IR::Instr::New(CVTSS2SD,&dstOpnd->super_Opnd,opndArg,this->m_func);
    IR::Instr::InsertBefore(instrInsert,pIVar4);
    IVar2 = opndArg->m_type;
  }
  if (1 < (byte)(IVar2 - TyFloat32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x5c8,"(opndArg->IsFloat())","opndArg->IsFloat()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pIVar4 = LoadHelperArgument(this,instrInsert,opndArg);
  return pIVar4;
}

Assistant:

IR::Instr *
LowererMDArch::LoadDoubleHelperArgument(IR::Instr * instrInsert, IR::Opnd * opndArg)
{
    IR::Opnd * float64Opnd;
    if (opndArg->GetType() == TyFloat32)
    {
        float64Opnd = IR::RegOpnd::New(TyFloat64, m_func);
        IR::Instr * instr = IR::Instr::New(Js::OpCode::CVTSS2SD, float64Opnd, opndArg, this->m_func);
        instrInsert->InsertBefore(instr);
    }
    else
    {
        float64Opnd = opndArg;
    }

    Assert(opndArg->IsFloat());

    return LoadHelperArgument(instrInsert, opndArg);
}